

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

LispPTR DSK_getfilename(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  DLword *pDVar10;
  char *pcVar11;
  LispPTR LVar12;
  char *pcVar13;
  long lVar14;
  char ver [16];
  char aname [255];
  char name [255];
  char dir [4096];
  char vname [4096];
  char lfname [4096];
  char file [4096];
  char local_4238 [16];
  char local_4228 [256];
  char local_4128 [256];
  char local_4028 [4096];
  char local_3028 [4096];
  char local_2028 [4096];
  char local_1028 [4096];
  
  iVar5 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar5 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  uVar2 = args[3];
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  Lisp_errno = (int *)(Lisp_world + uVar2);
  uVar2 = *args;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    iVar5 = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2;
    lVar9 = 5;
LAB_0011ce0b:
    if (0x1000 < (ulong)(iVar5 + lVar9)) {
      *Lisp_errno = 200;
      return 0;
    }
  }
  else {
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
      iVar5 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
      lVar9 = 3;
      goto LAB_0011ce0b;
    }
    error("LispStringLength: Not a character array.\n");
  }
  uVar2 = *args;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  iVar5 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
  iVar6 = 0x1000;
  if (iVar5 < 0x1000) {
    iVar6 = iVar5;
  }
  lVar9 = (long)iVar6;
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    if (iVar5 == 0) {
      pcVar13 = local_2028;
    }
    else {
      lVar9 = lVar9 + (ulong)(lVar9 == 0);
      pDVar10 = Lisp_world +
                (ulong)Lisp_world[(ulong)uVar2 + 2] +
                (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
      pcVar13 = local_2028;
      do {
        *pcVar13 = *(char *)((ulong)pDVar10 ^ 2);
        pcVar13 = pcVar13 + 1;
        pDVar10 = pDVar10 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    *pcVar13 = '\0';
  }
  else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
    if (iVar5 != 0) {
      uVar3 = *(uint *)(Lisp_world + uVar2);
      uVar1 = Lisp_world[(ulong)uVar2 + 2];
      lVar14 = 0;
      do {
        local_2028[lVar14] =
             *(char *)((long)Lisp_world + lVar14 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2 ^ 3
                      );
        lVar14 = lVar14 + 1;
      } while (lVar9 + (ulong)(lVar9 == 0) != lVar14);
    }
    local_2028[lVar9] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  iVar5 = unixpathname(local_2028,local_1028,1,0);
  if (iVar5 == 0) {
    return 0;
  }
  iVar5 = unpack_filename(local_1028,local_4028,local_4128,local_4238,1);
  if (iVar5 == 0) {
    return 0;
  }
  switch(args[1]) {
  case 0xe0000:
    iVar5 = true_name(local_4028);
    if (iVar5 != -1) {
      return 0;
    }
    if (local_4128[0] == '\0') {
      return 0;
    }
    iVar5 = get_version_array(local_4028,local_4128);
    if (iVar5 == 0) {
      return 0;
    }
    strcpy(local_4228,local_4128);
    if (local_4238[0] != '\0') {
      sVar8 = strlen(local_4228);
      (local_4228 + sVar8)[0] = '.';
      (local_4228 + sVar8)[1] = '~';
      local_4228[sVar8 + 2] = '\0';
      strcat(local_4228,local_4238);
      sVar8 = strlen(local_4228);
      (local_4228 + sVar8)[0] = '~';
      (local_4228 + sVar8)[1] = '\0';
    }
    iVar5 = get_old(local_4028,VA.files,local_4228,local_3028);
    goto LAB_0011d157;
  case 0xe0001:
    iVar5 = true_name(local_4028);
    if (iVar5 != -1) {
      return 0;
    }
    if (local_4128[0] == '\0') {
      return 0;
    }
    iVar5 = get_version_array(local_4028,local_4128);
    if (iVar5 == 0) {
      return 0;
    }
    strcpy(local_4228,local_4128);
    if (local_4238[0] != '\0') {
      sVar8 = strlen(local_4228);
      (local_4228 + sVar8)[0] = '.';
      (local_4228 + sVar8)[1] = '~';
      local_4228[sVar8 + 2] = '\0';
      strcat(local_4228,local_4238);
      sVar8 = strlen(local_4228);
      (local_4228 + sVar8)[0] = '~';
      (local_4228 + sVar8)[1] = '\0';
    }
    iVar5 = get_oldest(local_4028,VA.files,local_4228,local_3028);
LAB_0011d157:
    if (iVar5 == 0) {
      return 0;
    }
    iVar5 = true_name(local_4228);
    if (iVar5 + 1U < 2) {
      return 0;
    }
    break;
  case 0xe0002:
    pcVar13 = local_4028;
    iVar5 = true_name(pcVar13);
    if (iVar5 == -1) {
      pcVar11 = pcVar13;
      if (local_4128[0] == '\0') {
        return 0;
      }
      for (; (pcVar4 = pcVar11, *pcVar11 == '/' || (pcVar4 = pcVar13, *pcVar11 != '\0'));
          pcVar11 = pcVar11 + 1) {
        pcVar13 = pcVar4;
      }
      if (pcVar11 + -1 == pcVar13) {
        if (pcVar13 == local_4028) {
          local_4228[0] = '/';
          local_4228[1] = '\0';
        }
        else {
          strcpy(local_4228,local_4028);
        }
      }
      else {
        strcpy(local_4228,local_4028);
        sVar8 = strlen(local_4228);
        (local_4228 + sVar8)[0] = '/';
        (local_4228 + sVar8)[1] = '\0';
      }
      strcat(local_4228,local_4128);
      iVar5 = true_name(local_4228);
      if (iVar5 == -1) {
        return 0;
      }
      iVar5 = get_version_array(local_4028,local_4128);
      if (iVar5 == 0) {
        return 0;
      }
      strcpy(local_4228,local_4128);
      if (local_4238[0] != '\0') {
        sVar8 = strlen(local_4228);
        (local_4228 + sVar8)[0] = '.';
        (local_4228 + sVar8)[1] = '~';
        local_4228[sVar8 + 2] = '\0';
        strcat(local_4228,local_4238);
        sVar8 = strlen(local_4228);
        (local_4228 + sVar8)[0] = '~';
        (local_4228 + sVar8)[1] = '\0';
      }
      iVar5 = get_new(local_4028,VA.files,local_4228,local_3028);
      goto LAB_0011d630;
    }
LAB_0011d18f:
    strcpy(local_3028,local_1028);
    break;
  case 0xe0003:
    pcVar13 = local_4028;
    iVar5 = true_name(pcVar13);
    pcVar11 = pcVar13;
    if (iVar5 != -1) goto LAB_0011d18f;
    for (; (pcVar4 = pcVar11, *pcVar11 == '/' || (pcVar4 = pcVar13, *pcVar11 != '\0'));
        pcVar11 = pcVar11 + 1) {
      pcVar13 = pcVar4;
    }
    if (pcVar11 + -1 == pcVar13) {
      if (pcVar13 == local_4028) {
        local_4228[0] = '/';
        local_4228[1] = '\0';
      }
      else {
        strcpy(local_4228,local_4028);
      }
    }
    else {
      strcpy(local_4228,local_4028);
      sVar8 = strlen(local_4228);
      (local_4228 + sVar8)[0] = '/';
      (local_4228 + sVar8)[1] = '\0';
    }
    strcat(local_4228,local_4128);
    iVar5 = true_name(local_4228);
    if (iVar5 == -1) {
      return 0;
    }
    iVar5 = get_version_array(local_4028,local_4128);
    if (iVar5 == 0) {
      return 0;
    }
    strcpy(local_4228,local_4128);
    if (local_4238[0] != '\0') {
      sVar8 = strlen(local_4228);
      (local_4228 + sVar8)[0] = '.';
      (local_4228 + sVar8)[1] = '~';
      local_4228[sVar8 + 2] = '\0';
      strcat(local_4228,local_4238);
      sVar8 = strlen(local_4228);
      (local_4228 + sVar8)[0] = '~';
      (local_4228 + sVar8)[1] = '\0';
    }
    iVar5 = get_old_new(local_4028,VA.files,local_4228,local_3028);
LAB_0011d630:
    if (iVar5 == 0) {
      return 0;
    }
    break;
  case 0xe0005:
    pcVar13 = local_4028;
    iVar5 = true_name(pcVar13);
    pcVar11 = pcVar13;
    if (iVar5 != -1) {
      return 0;
    }
    for (; (pcVar4 = pcVar11, *pcVar11 == '/' || (pcVar4 = pcVar13, *pcVar11 != '\0'));
        pcVar11 = pcVar11 + 1) {
      pcVar13 = pcVar4;
    }
    if (pcVar11 + -1 == pcVar13) {
      if (pcVar13 == local_4028) {
        local_3028[0] = '/';
        local_3028[1] = '\0';
      }
      else {
        strcpy(local_3028,local_4028);
      }
    }
    else {
      strcpy(local_3028,local_4028);
      sVar8 = strlen(local_3028);
      (local_3028 + sVar8)[0] = '/';
      (local_3028 + sVar8)[1] = '\0';
    }
    strcat(local_3028,local_4128);
    strcpy(local_4228,local_3028);
    iVar5 = true_name(local_4228);
    if (iVar5 == -1) {
      strcpy(local_3028,local_4228);
    }
    iVar5 = lisppathname(local_3028,local_2028,(uint)(iVar5 == -1),0);
    if (iVar5 == 0) {
      return 0;
    }
    uVar2 = args[2];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    uVar7 = strlen(local_2028);
    pDVar10 = Lisp_world;
    if (uVar7 != 0xffffffffffffffff) {
      uVar2 = *(uint *)(Lisp_world + uVar2);
      lVar9 = 0;
      do {
        *(char *)((long)pDVar10 + lVar9 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) = local_2028[lVar9];
        lVar9 = lVar9 + 1;
      } while (uVar7 + 1 != lVar9);
      goto LAB_0011d236;
    }
    goto LAB_0011d561;
  }
  LVar12 = 0;
  iVar5 = lisppathname(local_3028,local_2028,0,1);
  if (iVar5 != 0) {
    uVar2 = args[2];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    uVar7 = strlen(local_2028);
    pDVar10 = Lisp_world;
    if (uVar7 != 0xffffffffffffffff) {
      uVar2 = *(uint *)(Lisp_world + uVar2);
      lVar9 = 0;
      do {
        *(char *)((long)pDVar10 + lVar9 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) = local_2028[lVar9];
        lVar9 = lVar9 + 1;
      } while (uVar7 + 1 != lVar9);
LAB_0011d236:
      if (uVar7 < 0x10000) {
        return (uint)uVar7 | 0xe0000;
      }
    }
LAB_0011d561:
    error("Not Smallp data");
    LVar12 = 0xe0000;
  }
  return LVar12;
}

Assistant:

LispPTR DSK_getfilename(LispPTR *args)
{
  char *base;
  size_t len;
  int rval;
  int dirp;
  int fatp;
  char lfname[MAXPATHLEN];
  char aname[MAXNAMLEN];
  char vname[MAXPATHLEN];
  char file[MAXPATHLEN];
  char dir[MAXPATHLEN];
  char name[MAXNAMLEN];
  char ver[VERSIONLEN];
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], len, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  len = fatp ? len + 4 + 1 : len + 2 + 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

#ifdef DOS
  separate_drive(lfname, drive);
#endif

/*
 * Convert a Lisp file name to UNIX one.  This is a DSK device method.
 * Thus we have to convert a version field too.  Third argument for
 * unixpathname specifies it.
 */
#ifdef DOS
  if (unixpathname(lfname, file, 1, 0, drive, &extlen, rawname) == 0) return (NIL);
#else
  if (unixpathname(lfname, file, 1, 0) == 0) return (NIL);
#endif

  if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);

  switch (args[1]) {
    case RECOG_OLD:
      /*
       * "Old" file means the "newest existing" file.  Thus, we have to
       * check dir is an existing directory or not.  The search has to
       * be done in case insensitive manner.  true_name does this work.
       */

      if (true_name(dir) != -1) {
        /* No such directory. */
        return (NIL);
      }
      /*
       * At this point, true_name has converted dir to the "true" name
       * of the directory.
       */
      if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        /*
         * Recognizing a file on DSK device needs the version information.
         * We gather version information in a version array first.
         */
        if (get_version_array(dir, name) == 0) return (NIL);

        ConcNameAndVersion(name, ver, aname);
        if (get_old(dir, VA.files, aname, vname) == 0) return (NIL);

        if ((rval = true_name(aname)) == 0) return (NIL);
        if (rval == -1) {
          /*
           * The specified file is a directory file.
           */
          strcpy(vname, aname);
          dirp = 1;
        } else {
#ifdef DOS
          strcpy(vname, aname);
#endif
          dirp = 0;
        }
      }

      break;

    case RECOG_OLDEST:
      /*
       * "Oldest" file means the "oldest existing" file.  Thus, we have to
       * check dir is an existing directory or not.
       */
      if (true_name(dir) != -1) {
        /* No such directory. */
        return (NIL);
      }
      if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        if (get_version_array(dir, name) == 0) return (NIL);

        ConcNameAndVersion(name, ver, aname);
        if (get_oldest(dir, VA.files, aname, vname) == 0) return (NIL);

        if ((rval = true_name(aname)) == 0) return (NIL);
        if (rval == -1) {
          /*
           * The specified file is a directory file.
           */
          strcpy(vname, aname);
          dirp = 1;
        } else {
#ifdef DOS
          strcpy(vname, aname);
#endif
          dirp = 0;
        }
      }
      break;

    case RECOG_NEW:
      /*
       * "New" file means the "not existing" file.  Thus it is not
       * necessary that dir is an existing directory.  If dir is not
       * an existing directory, we returns the specified file name
       * as if, the subsequent OPENFILE will find the truth.
       */
      if (true_name(dir) != -1) {
        strcpy(vname, file);
        dirp = 0;
      } else if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        ConcDirAndName(dir, name, aname);
        if ((rval = true_name(aname)) == -1) {
          strcpy(vname, aname);
          dirp = 1;
        } else {
          /*
           * Here, dir is an existing directory.  We have to perform
           * "new" recognition with the version information.
           */
          if (get_version_array(dir, name) == 0) return (NIL);

          ConcNameAndVersion(name, ver, aname);
          if (get_new(dir, VA.files, aname, vname) == 0) return (NIL);
          dirp = 0;
        }
      }
      break;

    case RECOG_OLD_NEW:
      /*
       * "Old/new" file means the "newest existing" or "not existing" file.
       * Thus, if dir is not an existing directory, we can return the
       * specified file name.  If it is an existing one, we have to
       * try "old" recognition on the directory first.  If the recognition
       * fails, we try "new" recognition.
       */
      if (true_name(dir) != -1) {
        strcpy(vname, file);
        dirp = 0;
      } else {
        ConcDirAndName(dir, name, aname);
        if ((rval = true_name(aname)) == -1) {
          strcpy(vname, aname);
          dirp = 1;
        } else {
          if (get_version_array(dir, name) == 0) return (NIL);

          ConcNameAndVersion(name, ver, aname);
          if (get_old_new(dir, VA.files, aname, vname) == 0) return (NIL);
          dirp = 0;
        }
      }
      break;

    case RECOG_NON:
      /*
       * "Non" recognition is used to recognize a sysout file.  The sysout
       * file is dealt with specially, it does not have any version, even
       * if it is on {DSK} device.  Only we have to do here is to make
       * sure the path to reach to the specified file is an existing
       * directories.  The file name itself is recognized as if.
       */
      if (true_name(dir) != -1) return (NIL);
      ConcDirAndName(dir, name, vname);
      strcpy(aname, vname);
      if (true_name(aname) == -1) {
        strcpy(vname, aname);
        dirp = 1;
      } else {
        dirp = 0;
      }
      if (lisppathname(vname, lfname, dirp, 0) == 0) return (NIL);
      STRING_BASE(args[2], base);
      len = strlen(lfname);

#ifndef BYTESWAP
      strncpy(base, lfname, len + 1);
#else
      StrNCpyFromCToLisp(base, lfname, len + 1);
#endif /* BYTESWAP */

      return (GetPosSmallp(len));
  }

  /*
   * DSK device does not recognize a directory file as a file.  Thus we should
   * return NIL when the recognized file is a directory.
   */
  if (dirp) return (NIL);

/*
 * Now, vname holds the "versioned" full name of the recognized file in UNIX
 * format.  We have to convert it back to Lisp format.  The version field
 * have to be converted.  The fourth argument for lisppathname specifies it.
 */
#ifdef DOS
  /* For DOS, have to assure we use the name asked for, not the */
  /* faked-up oversion-0 name, so reported names match. */
  {
    char dver[VERSIONLEN];
    separate_version(vname, dver, 0);
    ConcDirAndName(dir, name, aname);
    ConcNameAndVersion(aname, dver, vname);
  }
#endif /* DOS */

  if (lisppathname(vname, lfname, dirp, (dirp ? 0 : 1)) == 0) return (NIL);

  STRING_BASE(args[2], base);
  len = strlen(lfname);

#ifndef BYTESWAP
  strncpy(base, lfname, len + 1);
#else
  StrNCpyFromCToLisp(base, lfname, len + 1);
#endif /* BYTESWAP */

  return (GetPosSmallp(len));
}